

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::CleanupPendingUnroot(Recycler *this)

{
  undefined4 *puVar1;
  EntryType *current;
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *pDVar2;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  GuestArenaAllocator *pGVar7;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar8;
  ulong uVar9;
  undefined8 *in_FS_OFFSET;
  undefined1 local_40 [8];
  EditingIterator guestArenaIter;
  
  if (this->hasPendingConcurrentFindRoot == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1365,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar5) goto LAB_0026b0c5;
    *puVar1 = 0;
  }
  if (this->hasPendingUnpinnedObject == true) {
    if ((this->pinnedObjectMap).size != 0) {
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      uVar9 = 0;
      do {
        ppSVar8 = (this->pinnedObjectMap).table + uVar9;
        do {
          current = *ppSVar8;
          if (current != (EntryType *)0x0) {
            if (((current->value).refCount == 0) &&
               ((current->value).stackBackTraces != (StackBackTraceNode *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar1 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                 ,0x136c,"(refCount != 0 || refCount.stackBackTraces == nullptr)",
                                 "refCount != 0 || refCount.stackBackTraces == nullptr");
              if (!bVar5) goto LAB_0026b0c5;
              *puVar1 = 0;
            }
            if ((current->value).refCount == 0) {
              *ppSVar8 = current->next;
              SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
              ::FreeEntry(&this->pinnedObjectMap,current);
            }
            else {
              ppSVar8 = &current->next;
            }
          }
        } while (current != (EntryType *)0x0);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (this->pinnedObjectMap).size);
    }
    this->hasPendingUnpinnedObject = false;
  }
  local_40 = (undefined1  [8])&this->guestArenaList;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_40;
  if (this->hasPendingDeleteGuestArena == true) {
    bVar5 = false;
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_0026b0c5;
        *puVar1 = 0;
      }
      pDVar2 = ((guestArenaIter.super_Iterator.list)->
               super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
      guestArenaIter.super_Iterator.list =
           (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pDVar2 == local_40) break;
      guestArenaIter.super_Iterator.list = pDVar2;
      pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_40);
      if (pGVar7->pendingDelete == true) {
        (pGVar7->super_ArenaAllocator).
        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
        lockBlockList = false;
        DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)local_40,&HeapAllocator::Instance);
        bVar5 = true;
      }
    }
    this->hasPendingDeleteGuestArena = false;
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1383,"(foundPendingDelete)","foundPendingDelete");
      if (!bVar5) {
LAB_0026b0c5:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar1 = 0;
    }
  }
  else {
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_0026b0c5;
        *puVar1 = 0;
      }
      guestArenaIter.super_Iterator.list =
           ((guestArenaIter.super_Iterator.list)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
      if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_40) break;
      pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_40);
      if (pGVar7->pendingDelete == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x138c,"(!allocator.pendingDelete)","!allocator.pendingDelete");
        if (!bVar5) goto LAB_0026b0c5;
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void
Recycler::CleanupPendingUnroot()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    if (hasPendingUnpinnedObject)
    {
        pinnedObjectMap.MapAndRemoveIf([](void * obj, PinRecord const &refCount)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            Assert(refCount != 0 || refCount.stackBackTraces == nullptr);
#endif
#endif
            return refCount == 0;
        });
        hasPendingUnpinnedObject = false;
    }

    if (hasPendingDeleteGuestArena)
    {
        DebugOnly(bool foundPendingDelete = false);
        DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            if (allocator.pendingDelete)
            {
                allocator.SetLockBlockList(false);
                guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
                DebugOnly(foundPendingDelete = true);
            }
        }
        hasPendingDeleteGuestArena = false;
        Assert(foundPendingDelete);
    }
#if DBG
    else
    {
        DListBase<GuestArenaAllocator>::Iterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            Assert(!allocator.pendingDelete);
        }
    }
#endif
}